

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

BOOL __thiscall Memory::Recycler::DoCollect(Recycler *this,CollectionFlags flags)

{
  Boolean BVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  CollectionFlags CVar5;
  BOOL BVar6;
  ConfigFlagsTable *pCVar7;
  undefined4 *puVar8;
  undefined1 local_568 [7];
  bool skipConcurrent;
  RecyclerCollectionStats oldCollectionStats;
  bool collected;
  BOOL forceInThread;
  bool concurrent;
  BOOL partial;
  CollectionFlags flags_local;
  Recycler *this_local;
  
  this->hasIncompleteDoCollect = false;
  Verify(this,RecyclerPhase);
  VerifyFinalize(this);
  forceInThread = flags & CollectMode_Partial;
  pCVar7 = GetRecyclerFlagsTable(this);
  if ((pCVar7->RecyclerPartialStress & 1U) == 0) {
    pCVar7 = GetRecyclerFlagsTable(this);
    if ((((pCVar7->DumpObjectGraphOnCollect & 1U) != 0) ||
        ((this->dumpObjectOnceOnCollect & 1U) != 0)) &&
       (pCVar7 = GetRecyclerFlagsTable(this), (pCVar7->RecyclerPartialStress & 1U) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0xf37,"(!GetRecyclerFlagsTable().RecyclerPartialStress)",
                         "!GetRecyclerFlagsTable().RecyclerPartialStress");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
  }
  else {
    pCVar7 = GetRecyclerFlagsTable(this);
    if (((pCVar7->DumpObjectGraphOnCollect & 1U) != 0) ||
       ((this->dumpObjectOnceOnCollect & 1U) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0xf35,
                         "(!GetRecyclerFlagsTable().DumpObjectGraphOnCollect && !this->dumpObjectOnceOnCollect)"
                         ,
                         "!GetRecyclerFlagsTable().DumpObjectGraphOnCollect && !this->dumpObjectOnceOnCollect"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
  }
  if ((forceInThread != 0) &&
     (pCVar7 = GetRecyclerFlagsTable(this), (pCVar7->RecyclerPartialStress & 1U) != 0)) {
    this->inPartialCollectMode = true;
    this->forcePartialScanStack = true;
  }
  if (((this->dumpObjectOnceOnCollect & 1U) != 0) ||
     (pCVar7 = GetRecyclerFlagsTable(this), (pCVar7->DumpObjectGraphOnCollect & 1U) != 0)) {
    DumpObjectGraph(this,(Param *)0x0);
    this->dumpObjectOnceOnCollect = false;
    forceInThread = 0;
  }
  bVar3 = (flags & CollectMode_Concurrent) != 0;
  CVar5 = flags & CollectNowForceInThread;
  BVar6 = CollectionInProgress(this);
  if (BVar6 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xf59,"(!this->CollectionInProgress())","!this->CollectionInProgress()");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if (this->backgroundFinishMarkCount != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xf5b,"(this->backgroundFinishMarkCount == 0)",
                       "this->backgroundFinishMarkCount == 0");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  oldCollectionStats.numZeroedOutSmallBlocks._3_1_ = FinishDisposeObjects(this);
  do {
    BVar6 = CollectionInProgress(this);
    if (BVar6 != 0) {
      BVar6 = IsConcurrentState(this);
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0xf6d,"(this->IsConcurrentState())","this->IsConcurrentState()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      if ((oldCollectionStats.numZeroedOutSmallBlocks._3_1_ & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0xf6e,"(collected)","collected");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      if (CVar5 != 0) {
        BVar6 = FinishConcurrentCollect(this,flags);
        return BVar6;
      }
      return 1;
    }
    if (this->backgroundFinishMarkCount != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0xf77,"(this->backgroundFinishMarkCount == 0)",
                         "this->backgroundFinishMarkCount == 0");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    this->collectionCount = this->collectionCount + 1;
    SetCollectionState(this,Collection_PreCollection);
    (**this->collectionWrapper->_vptr_RecyclerCollectionWrapper)();
    SetCollectionState(this,CollectionStateNotCollecting);
    this->hasExhaustiveCandidate = false;
    memcpy(local_568,&this->collectionStats,0x538);
    memset(&this->collectionStats,0,0x538);
    (this->collectionStats).startCollectAllocBytes = (this->autoHeap).uncollectedAllocBytes;
    (this->collectionStats).startCollectNewPageCount = (this->autoHeap).uncollectedNewPageCount;
    (this->collectionStats).uncollectedNewPageCountPartialCollect =
         this->uncollectedNewPageCountPartialCollect;
    if (forceInThread == 0) {
      this->decommitOnFinish = true;
      if ((this->inPartialCollectMode & 1U) != 0) {
        FinishPartialCollect(this,(RecyclerSweepManager *)0x0);
        oldCollectionStats.numZeroedOutSmallBlocks._3_1_ = 1;
      }
      pCVar7 = GetRecyclerFlagsTable(this);
      BVar1 = pCVar7->ForceBlockingConcurrentCollect;
      ResetHeuristicCounters(this);
      if ((bVar3) && ((BVar1 & 1U) == 0)) {
        if (CVar5 != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                             ,0xfec,"(!forceInThread)","!forceInThread");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        if (((this->enableConcurrentMark & 1U) != 0) &&
           (BVar6 = StartBackgroundMarkCollect(this), BVar6 != 0)) {
          return (uint)(oldCollectionStats.numZeroedOutSmallBlocks._3_1_ & 1);
        }
        if ((this->enableConcurrentSweep & 1U) != 0) {
          BVar6 = StartConcurrentSweepCollect(this);
          if (BVar6 == 0) {
            return (uint)(oldCollectionStats.numZeroedOutSmallBlocks._3_1_ & 1);
          }
          goto LAB_009a2c52;
        }
      }
      if ((CVar5 == 0) && ((this->enableConcurrentMark & 1U) != 0)) {
        BVar6 = CollectOnConcurrentThread(this);
        if (BVar6 == 0) {
          return (uint)(oldCollectionStats.numZeroedOutSmallBlocks._3_1_ & 1);
        }
      }
      else {
        BVar6 = CollectOnAllocatorThread(this);
        if (BVar6 == 0) {
          return (uint)(oldCollectionStats.numZeroedOutSmallBlocks._3_1_ & 1);
        }
      }
      (this->collectionParam).repeat = true;
    }
    else {
      if (CVar5 != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0xfb3,"(!forceInThread)","!forceInThread");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      (this->collectionStats).finalizeCount = oldCollectionStats.trackCount;
      memcpy((this->collectionStats).heapBlockCount,
             oldCollectionStats.smallNonLeafHeapBlockPartialReuseBytes + 10,0x58);
      memcpy((this->collectionStats).heapBlockFreeByteCount,
             oldCollectionStats.smallNonLeafHeapBlockPartialUnusedCount + 10,0x58);
      memcpy((this->collectionStats).smallNonLeafHeapBlockPartialUnusedCount,
             oldCollectionStats.smallNonLeafHeapBlockPartialReuseBytes + 10,0x58);
      memcpy((this->collectionStats).smallNonLeafHeapBlockPartialUnusedBytes,
             oldCollectionStats.smallNonLeafHeapBlockPartialUnusedCount + 10,0x58);
      if (((this->enablePartialCollect & 1U) == 0) || ((this->inPartialCollectMode & 1U) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0xfc1,"(enablePartialCollect && inPartialCollectMode)",
                           "enablePartialCollect && inPartialCollectMode");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      bVar4 = PartialCollect(this,bVar3);
      if (!bVar4) {
        return (uint)(oldCollectionStats.numZeroedOutSmallBlocks._3_1_ & 1);
      }
      forceInThread = 0;
    }
LAB_009a2c52:
    oldCollectionStats.numZeroedOutSmallBlocks._3_1_ = 1;
    bVar4 = NeedExhaustiveRepeatCollect(this);
    if (!bVar4) {
      BVar6 = CollectionInProgress(this);
      if (BVar6 == 0) {
        EndCollection(this);
        this_local._4_4_ = (uint)(oldCollectionStats.numZeroedOutSmallBlocks._3_1_ & 1);
      }
      else {
        BVar6 = IsConcurrentState(this);
        if (BVar6 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                             ,0x1026,"(this->IsConcurrentState())","this->IsConcurrentState()");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        if ((oldCollectionStats.numZeroedOutSmallBlocks._3_1_ & 1) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                             ,0x1027,"(collected)","collected");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        this_local._4_4_ = 1;
      }
      return this_local._4_4_;
    }
  } while( true );
}

Assistant:

BOOL
Recycler::DoCollect(CollectionFlags flags)
{
    // ExecuteRecyclerCollectionFunction may cause exception. In which case, we may trigger the assert
    // in SetupPostCollectionFlags because we didn't reset the inExhaustiveCollection variable if
    // an exception. We are not in DoCollect, there shouldn't be any more exception. Reset the flag
    DebugOnly(this->hasIncompleteDoCollect = false);

#ifdef RECYCLER_MEMORY_VERIFY
    this->Verify(Js::RecyclerPhase);
#endif
#ifdef RECYCLER_FINALIZE_CHECK
    this->VerifyFinalize();
#endif
#if ENABLE_PARTIAL_GC
    BOOL partial = flags & CollectMode_Partial;

#if DBG && defined(RECYCLER_DUMP_OBJECT_GRAPH)
    // Can't pass in RecyclerPartialStress and DumpObjectGraphOnCollect or call CollectGarbage with DumpObjectGraph
    if (GetRecyclerFlagsTable().RecyclerPartialStress) {
        Assert(!GetRecyclerFlagsTable().DumpObjectGraphOnCollect && !this->dumpObjectOnceOnCollect);
    } else if (GetRecyclerFlagsTable().DumpObjectGraphOnCollect || this->dumpObjectOnceOnCollect) {
        Assert(!GetRecyclerFlagsTable().RecyclerPartialStress);
    }
#endif

#ifdef RECYCLER_STRESS
    if (partial && GetRecyclerFlagsTable().RecyclerPartialStress)
    {
        this->inPartialCollectMode = true;
        this->forcePartialScanStack = true;
    }
#endif

#endif
#ifdef RECYCLER_DUMP_OBJECT_GRAPH
    if (dumpObjectOnceOnCollect || GetRecyclerFlagsTable().DumpObjectGraphOnCollect)
    {
        DumpObjectGraph();
        dumpObjectOnceOnCollect = false;

#if ENABLE_PARTIAL_GC
        // Can't do a partial collect if DumpObjectGraph is set since it'll call FinishPartial
        // which will set inPartialCollectMode to false.
        partial = false;
#endif
    }
#endif
#if ENABLE_CONCURRENT_GC
    const bool concurrent = (flags & CollectMode_Concurrent) != 0;
    const BOOL forceInThread = flags & CollectOverride_ForceInThread;
#else
    const bool concurrent = false;
#endif

    // Flush the pending dispose objects first if dispose is allowed
    Assert(!this->CollectionInProgress());
#if ENABLE_CONCURRENT_GC
    Assert(this->backgroundFinishMarkCount == 0);
#endif

    bool collected = FinishDisposeObjects();

    do
    {
        INC_TIMESTAMP_FIELD(exhaustiveRepeatedCount);
        RECORD_TIMESTAMP(currentCollectionStartTime);
#ifdef NTBUILD
        this->telemetryBlock->currentCollectionStartProcessUsedBytes = PageAllocator::GetProcessUsedBytes();
#endif

#if ENABLE_CONCURRENT_GC
        // DisposeObject may call script again and start another GC, so we may still be in concurrent GC state

        if (this->CollectionInProgress())
        {
            Assert(this->IsConcurrentState());
            Assert(collected);

            if (forceInThread)
            {
                return this->FinishConcurrentCollect(flags);
            }

            return true;
        }
        Assert(this->backgroundFinishMarkCount == 0);
#endif

#ifdef ENABLE_JS_ETW
        this->collectionStartFlags = flags;

        if (flags == CollectOnScriptIdle)
        {
            collectionStartReason = ETWEventGCActivationTrigger::ETWEvent_GC_Trigger_IdleCollect;
        }

        const BOOL timedIfScriptActive = flags & CollectHeuristic_TimeIfScriptActive;
        const BOOL timedIfInScript = flags & CollectHeuristic_TimeIfInScript;
        if (IS_UNKNOWN_GC_TRIGGER(collectionStartReason) && (flags & CollectHeuristic_Mask))
        {
            if (timedIfScriptActive)
            {
                collectionStartReason = ETWEventGCActivationTrigger::ETWEvent_GC_Trigger_TimeAndAllocSizeIfScriptActive_Heuristic;
            }
            else if (timedIfInScript)
            {
                collectionStartReason = ETWEventGCActivationTrigger::ETWEvent_GC_Trigger_TimeAndAllocSizeIfInScript_Heuristic;
            }
            else
            {
                collectionStartReason = ETWEventGCActivationTrigger::ETWEvent_GC_Trigger_TimeAndAllocSize_Heuristic;
            }
        }

        if (IS_UNKNOWN_GC_TRIGGER(collectionStartReason))
        {
            this->collectionStartReason = ETWEventGCActivationTrigger::ETWEvent_GC_Trigger_NoHeuristic;
        }
#endif

#if DBG || defined RECYCLER_TRACE
        collectionCount++;
#endif
        this->SetCollectionState(Collection_PreCollection);
        collectionWrapper->PreCollectionCallBack(flags);
        this->SetCollectionState(CollectionStateNotCollecting);

        hasExhaustiveCandidate = false;         // reset the candidate detection

#ifdef RECYCLER_STATS
#if ENABLE_PARTIAL_GC
        RecyclerCollectionStats oldCollectionStats = collectionStats;
#endif
        memset(&collectionStats, 0, sizeof(RecyclerCollectionStats));
        this->collectionStats.startCollectAllocBytes = autoHeap.uncollectedAllocBytes;
#if ENABLE_PARTIAL_GC
        this->collectionStats.startCollectNewPageCount = autoHeap.uncollectedNewPageCount;
        this->collectionStats.uncollectedNewPageCountPartialCollect = this->uncollectedNewPageCountPartialCollect;
#endif
#endif

#if ENABLE_PARTIAL_GC
        if (partial)
        {
#if ENABLE_CONCURRENT_GC
            Assert(!forceInThread);
#endif
#ifdef RECYCLER_STATS
            // We are only doing a partial GC, copy some old stats
            collectionStats.finalizeCount = oldCollectionStats.finalizeCount;
            memcpy(collectionStats.heapBlockCount, oldCollectionStats.smallNonLeafHeapBlockPartialUnusedCount,
                sizeof(oldCollectionStats.smallNonLeafHeapBlockPartialUnusedCount));
            memcpy(collectionStats.heapBlockFreeByteCount, oldCollectionStats.smallNonLeafHeapBlockPartialUnusedBytes,
                sizeof(oldCollectionStats.smallNonLeafHeapBlockPartialUnusedBytes));
            memcpy(collectionStats.smallNonLeafHeapBlockPartialUnusedCount, oldCollectionStats.smallNonLeafHeapBlockPartialUnusedCount,
                sizeof(oldCollectionStats.smallNonLeafHeapBlockPartialUnusedCount));
            memcpy(collectionStats.smallNonLeafHeapBlockPartialUnusedBytes, oldCollectionStats.smallNonLeafHeapBlockPartialUnusedBytes,
                sizeof(oldCollectionStats.smallNonLeafHeapBlockPartialUnusedBytes));
#endif
            Assert(enablePartialCollect && inPartialCollectMode);

            if (!this->PartialCollect(concurrent))
            {
                return collected;
            }
            // This disable partial if we do a repeated exhaustive GC
            partial = false;
            collected = true;
            continue;
        }

        // Not doing partial collect, we should decommit on finish collect
        decommitOnFinish = true;

        if (inPartialCollectMode)
        {
            // finish the partial collect first
            FinishPartialCollect();

            // Old heap block with free object is made available, count that as being collected
            collected = true;
            // PARTIAL-GC-CONSIDER: should we just pretend we did a GC, since we have made the free listed object
            // available to be used, instead of starting off another GC?
        }
#endif

#if ENABLE_CONCURRENT_GC

        bool skipConcurrent = false;
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS

        // If the below flag is passed in, skip doing a non-blocking concurrent collect. Instead,
        // we will do a blocking concurrent collect, which is basically an in-thread GC
        skipConcurrent = GetRecyclerFlagsTable().ForceBlockingConcurrentCollect;
#endif

        // We are about to start a collection. Reset our heuristic counters now, so that
        // any allocations that occur during concurrent collection count toward the next collection's threshold.
        ResetHeuristicCounters();

        if (concurrent && !skipConcurrent)
        {
            Assert(!forceInThread);
            if (enableConcurrentMark)
            {
                if (StartBackgroundMarkCollect())
                {
                    // Tell the caller whether we have finish a collection and there maybe free object to reuse
                    return collected;
                }

                // Either ResetWriteWatch failed or the thread service failed
                // So concurrent mark is disabled, at least for now
            }

            if (enableConcurrentSweep)
            {
                if (StartConcurrentSweepCollect())
                {
                    collected = true;
                    continue;
                }

                // out of memory during collection
                return collected;
            }

            // concurrent collection failed, default back to non-concurrent collection
        }

        if (!forceInThread && enableConcurrentMark)
        {
            if (!CollectOnConcurrentThread())
            {
                // time out or out of memory during collection
                return collected;
            }
         }
        else
#endif
        {
            if (!CollectOnAllocatorThread())
            {
                // out of memory during collection
                return collected;
            }
        }

        collected = true;
#ifdef RECYCLER_TRACE
        collectionParam.repeat = true;
#endif
    }
    while (this->NeedExhaustiveRepeatCollect());

#if ENABLE_CONCURRENT_GC
    // DisposeObject may call script again and start another GC, so we may still be in concurrent GC state

    if (this->CollectionInProgress())
    {
        Assert(this->IsConcurrentState());
        Assert(collected);
        return true;
    }
#endif

    EndCollection();

    // Tell the caller whether we have finish a collection and there maybe free object to reuse
    return collected;
}